

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

void createstdfile(lua_State *L,FILE *f,char *k,char *fname)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)lua_newuserdatauv(L,0x10,0);
  puVar1[1] = 0;
  luaL_setmetatable(L,"FILE*");
  *puVar1 = f;
  puVar1[1] = io_noclose;
  if (k != (char *)0x0) {
    lua_pushvalue(L,-1);
    lua_setfield(L,-0xf4628,k);
  }
  lua_setfield(L,-2,fname);
  return;
}

Assistant:

static void createstdfile (lua_State *L, FILE *f, const char *k,
                           const char *fname) {
  LStream *p = newprefile(L);
  p->f = f;
  p->closef = &io_noclose;
  if (k != NULL) {
    lua_pushvalue(L, -1);
    lua_setfield(L, LUA_REGISTRYINDEX, k);  /* add file to registry */
  }
  lua_setfield(L, -2, fname);  /* add file to module */
}